

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_utils.c
# Opt level: O2

void fill_with_pseudorandom_data(void *buffer,size_t size)

{
  FILE *__stream;
  int iVar1;
  char *__nptr;
  int *piVar2;
  ulonglong uVar3;
  ulong uVar4;
  ulong uVar5;
  size_t __n;
  void *pvVar6;
  
  __nptr = getenv("TEST_RANDOM_SEED");
  if (__nptr != (char *)0x0) {
    piVar2 = __errno_location();
    *piVar2 = 0;
    uVar3 = strtoull(__nptr,(char **)0x0,10);
    __stream = _stderr;
    if (*piVar2 == 0) goto LAB_001152bf;
    strerror(*piVar2);
    fprintf(__stream,"strtoull(%s) failed: %s",__nptr);
  }
  iVar1 = rand();
  uVar3 = (ulonglong)iVar1;
LAB_001152bf:
  uVar4 = (ulong)buffer & 7;
  if (uVar4 == 0) {
    __n = 0;
    pvVar6 = buffer;
  }
  else {
    __n = 8 - uVar4;
    memset(buffer,0xab,__n);
    pvVar6 = (void *)((long)buffer + (8 - uVar4));
  }
  if (((ulong)pvVar6 & 7) != 0) {
    __assert_fail("(uintptr_t)aligned_buffer % sizeof(uint64_t) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/test_utils/test_utils.c"
                  ,0x4d,"void fill_with_pseudorandom_data_seed(uint64_t, void *, size_t)");
  }
  for (uVar4 = 0; size - __n >> 3 != uVar4; uVar4 = uVar4 + 1) {
    uVar5 = uVar3 << 0xd ^ uVar3;
    uVar5 = uVar5 >> 7 ^ uVar5;
    uVar3 = uVar5 << 0x11 ^ uVar5;
    *(ulonglong *)((long)pvVar6 + uVar4 * 8) = uVar3;
  }
  uVar4 = size - __n & 7;
  if (uVar4 == 0) {
    return;
  }
  memset((void *)((long)buffer + (size - uVar4)),0xcd,uVar4);
  return;
}

Assistant:

void
fill_with_pseudorandom_data(void *buffer, size_t size)
{
	uint64_t seed;
	const char* seed_str;
	/*
	 * Check if a seed has been specified in the environment, otherwise fall
	 * back to using rand() as a seed.
	 */
	if ((seed_str = getenv("TEST_RANDOM_SEED")) != NULL) {
		errno = 0;
		seed = strtoull(seed_str, NULL, 10);
		if (errno != 0) {
			fprintf(stderr, "strtoull(%s) failed: %s", seed_str,
			    strerror(errno));
			seed = rand();
		}
	} else {
		seed = rand();
	}
	fill_with_pseudorandom_data_seed(seed, buffer, size);
}